

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.cpp
# Opt level: O0

void * slang::detail::allocArray(size_t capacity,size_t typeSize)

{
  void *pvVar1;
  bad_alloc *this;
  void *result;
  size_t typeSize_local;
  size_t capacity_local;
  
  pvVar1 = malloc(capacity * typeSize);
  if (pvVar1 == (void *)0x0) {
    this = (bad_alloc *)__cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(this);
    __cxa_throw(this,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  return pvVar1;
}

Assistant:

void* allocArray(size_t capacity, size_t typeSize) {
    void* result = std::malloc(capacity * typeSize);
    if (!result)
        throw std::bad_alloc();

    return result;
}